

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snp_vs_vcf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  pointer __first;
  pointer __last;
  pointer pbVar4;
  size_type sVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  istream *piVar11;
  int *piVar12;
  call *pcVar13;
  long *plVar14;
  long lVar15;
  ulong uVar16;
  call *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  difference_type __d;
  long lVar21;
  bool bVar22;
  string *this;
  ulong uVar23;
  difference_type __d_1;
  pointer pbVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  string ALT;
  vector<call,_std::allocator<call>_> calls_vcf;
  string left_context;
  string DNA2;
  string right_context_1;
  string line;
  int pos;
  string right_context;
  string left_context1;
  vector<call,_std::allocator<call>_> found_calls_vcf;
  string left_context2;
  string h2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contigs;
  vector<int,_std::allocator<int>_> assigned;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ref;
  string right_context2;
  string contig;
  set<int,_std::less<int>,_std::allocator<int>_> found;
  set<int,_std::less<int>,_std::allocator<int>_> found_nonisolated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  left_contexts;
  ifstream calls_file;
  ifstream vcf_file;
  ifstream ref_file;
  undefined1 auStack_ce8 [8];
  double local_ce0;
  byte *local_cd8;
  long local_cd0;
  byte local_cc8 [16];
  vector<call,_std::allocator<call>_> local_cb8;
  char *local_c98;
  ulong local_c90;
  char local_c88 [16];
  char *local_c78;
  ulong local_c70;
  char local_c68 [16];
  undefined1 *local_c58;
  long local_c50;
  undefined1 local_c48 [16];
  double local_c38;
  double dStack_c30;
  char *local_c20;
  long local_c18;
  char local_c10 [16];
  long local_c00;
  int local_bf8;
  undefined4 uStack_bf4;
  ulong local_bf0;
  undefined1 local_be8 [16];
  byte *local_bd8;
  undefined8 local_bd0;
  byte local_bc8 [16];
  undefined1 *local_bb8;
  ulong local_bb0;
  undefined1 local_ba8 [16];
  long local_b98;
  int local_b8c;
  undefined1 local_b88 [32];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 local_b48;
  char local_b47;
  undefined8 local_b40;
  undefined1 local_b38;
  undefined4 local_b34;
  double local_b28;
  double dStack_b20;
  undefined1 *local_b18;
  ulong local_b10;
  undefined1 local_b08 [16];
  char *local_af8;
  long local_af0;
  char local_ae8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ad8;
  vector<int,_std::allocator<int>_> local_ab8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_aa0;
  undefined1 *local_a70;
  ulong local_a68;
  undefined1 local_a60 [16];
  pointer local_a50;
  long local_a48;
  pointer local_a40;
  long local_a38;
  undefined1 local_a30 [88];
  long local_9d8;
  char local_9d0 [16];
  value_type local_9c0;
  undefined1 local_9a0 [32];
  _Alloc_hider local_980;
  size_type local_978;
  char local_970 [16];
  byte local_960;
  byte local_95f;
  uint64_t local_958;
  bool local_950;
  int local_94c;
  ios_base local_928 [264];
  undefined1 local_820 [32];
  _Rb_tree_node_base *local_800;
  size_t local_7f8;
  _Rb_tree_node_base local_7f0;
  undefined1 local_7d0;
  undefined4 local_7cc;
  ios_base local_7a8 [264];
  string local_6a0;
  string local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  value_type_conflict1 local_648;
  undefined4 uStack_644;
  byte abStack_628 [88];
  ios_base local_5d0 [400];
  key_type local_440;
  byte abStack_420 [488];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  byte abStack_218 [488];
  
  if (argc < 4) {
switchD_00104a0a_caseD_64:
    help();
LAB_00106e88:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error: malformed SNP file. Two reads with different length in a SNP:\n",0x45);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_cd8,local_cd0);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c98,local_c90);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_af8,local_af0);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c78,local_c70);
    std::endl<char,std::char_traits<char>>(poVar10);
    exit(1);
  }
LAB_001049ee:
  iVar8 = getopt(argc,argv,"hv:c:f:l:k:");
  switch(iVar8) {
  case 99:
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &calls_path_abi_cxx11_;
    break;
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
    goto switchD_00104a0a_caseD_64;
  case 0x66:
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &ref_path_abi_cxx11_;
    break;
  case 0x6b:
    k_nonis = atoi(_optarg);
    goto LAB_001049ee;
  case 0x6c:
    goto switchD_00104a0a_caseD_6c;
  default:
    if (iVar8 != 0x76) {
      if (iVar8 == -1) {
        if (rlength == 0) {
          rlength = rlength_def;
        }
        if (k_nonis == 0) {
          k_nonis = k_nonis_def;
        }
        iVar8 = std::__cxx11::string::compare((char *)&vcf_path_abi_cxx11_);
        if (((iVar8 != 0) &&
            (iVar8 = std::__cxx11::string::compare((char *)&calls_path_abi_cxx11_), iVar8 != 0)) &&
           (iVar8 = std::__cxx11::string::compare((char *)&ref_path_abi_cxx11_), iVar8 != 0)) {
          local_aa0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_aa0._M_impl.super__Rb_tree_header._M_header;
          local_aa0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_aa0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_aa0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_aa0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_aa0._M_impl.super__Rb_tree_header._M_header._M_left;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading reference ... ",0x16);
          std::ostream::flush();
          std::ifstream::ifstream(local_238);
          std::ifstream::open((string *)local_238,0x10d218);
          local_c20 = local_c10;
          local_c18 = 0;
          local_c10[0] = '\0';
          local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
          local_9c0._M_string_length = 0;
          local_9c0.field_2._M_local_buf[0] = '\0';
          local_ad8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_ad8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_ad8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar21 = *(long *)(local_238[0] + -0x18);
          if ((abStack_218[lVar21] & 2) == 0) {
            do {
              cVar6 = std::ios::widen((char)auStack_ce8 + (char)lVar21 + -0x50);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_c20,cVar6);
              lVar21 = local_c18;
              pcVar1 = local_c20;
              if (*local_c20 == '>') {
                std::__cxx11::string::substr((ulong)&local_440,(ulong)&local_c20);
                std::__cxx11::string::operator=((string *)&local_9c0,(string *)&local_440);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p != &local_440.field_2) {
                  operator_delete(local_440._M_dataplus._M_p);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_ad8,&local_9c0);
                local_440._M_string_length = 0;
                local_440.field_2._M_local_buf[0] = '\0';
                local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_aa0,&local_9c0);
                std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_440);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_dataplus._M_p != &local_440.field_2) {
                  operator_delete(local_440._M_dataplus._M_p);
                }
              }
              else {
                if (local_c18 != 0) {
                  lVar26 = 0;
                  do {
                    iVar8 = toupper((int)pcVar1[lVar26]);
                    pcVar1[lVar26] = (char)iVar8;
                    lVar26 = lVar26 + 1;
                  } while (lVar21 != lVar26);
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_aa0,&local_9c0);
                std::__cxx11::string::_M_append((char *)pmVar9,(ulong)local_c20);
              }
              lVar21 = *(long *)(local_238[0] + -0x18);
            } while ((abStack_218[lVar21] & 2) == 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Contig\tlength",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          pbVar4 = local_ad8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_ad8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_ad8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_c00 = 0;
          }
          else {
            local_c00 = 0;
            pbVar24 = local_ad8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
              pcVar3 = (pbVar24->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_440,pcVar3,pcVar3 + pbVar24->_M_string_length);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_440._M_dataplus._M_p,
                                   local_440._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_aa0,&local_440);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_aa0,&local_440);
              local_c00 = local_c00 + pmVar9->_M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != &local_440.field_2) {
                operator_delete(local_440._M_dataplus._M_p);
              }
              pbVar24 = pbVar24 + 1;
            } while (pbVar24 != pbVar4);
          }
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading VCF ... ",0x10);
          std::ostream::flush();
          std::ifstream::ifstream(&local_440);
          std::ifstream::open((string *)&local_440,0x10d1d8);
          local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start = (call *)0x0;
          local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish = (call *)0x0;
          local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          lVar21 = *(long *)(local_440._M_dataplus._M_p + -0x18);
          if ((abStack_420[lVar21] & 2) == 0) {
            local_b98 = 0;
            local_ce0 = 0.0;
            do {
              cVar6 = std::ios::widen((char)auStack_ce8 + (char)lVar21 + -0x58);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_440,(string *)&local_c20,cVar6);
              if ((local_c18 != 0) && (*local_c20 != '#')) {
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)&local_648,(string *)&local_c20,_S_in);
                local_820._0_8_ = local_820 + 0x10;
                local_820._8_8_ = 0;
                local_820._16_8_ = local_820._16_8_ & 0xffffffffffffff00;
                local_b88._0_8_ = local_b88 + 0x10;
                local_b88._8_8_ = (pointer)0x0;
                local_b88._16_8_ = local_b88._16_8_ & 0xffffffffffffff00;
                local_bd8 = local_bc8;
                local_bd0 = 0;
                local_bc8[0] = 0;
                local_cd8 = local_cc8;
                local_cd0 = 0;
                local_cc8[0] = 0;
                piVar11 = std::operator>>((istream *)&local_648,(string *)local_820);
                piVar11 = (istream *)std::istream::operator>>(piVar11,&local_bf8);
                piVar11 = std::operator>>(piVar11,(string *)local_b88);
                piVar11 = std::operator>>(piVar11,(string *)&local_bd8);
                std::operator>>(piVar11,(string *)&local_cd8);
                local_bf8 = local_bf8 + -1;
                iVar8 = std::__cxx11::string::compare((char *)&local_bd8);
                if (((iVar8 == 0) ||
                    ((iVar8 = std::__cxx11::string::compare((char *)&local_bd8), iVar8 == 0 ||
                     (iVar8 = std::__cxx11::string::compare((char *)&local_bd8), iVar8 == 0)))) ||
                   (iVar8 = std::__cxx11::string::compare((char *)&local_bd8), iVar8 == 0)) {
                  iVar8 = std::__cxx11::string::compare((char *)&local_cd8);
                  if ((((iVar8 == 0) ||
                       (iVar8 = std::__cxx11::string::compare((char *)&local_cd8), iVar8 == 0)) ||
                      (iVar8 = std::__cxx11::string::compare((char *)&local_cd8), iVar8 == 0)) ||
                     (iVar8 = std::__cxx11::string::compare((char *)&local_cd8), iVar8 == 0)) {
                    pmVar9 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_aa0,(key_type *)local_820);
                    iVar8 = std::__cxx11::string::compare((char *)pmVar9);
                    if (iVar8 == 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"WARNING: chromosome ",0x14);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_820._0_8_,
                                           local_820._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10," not found. ",0xc)
                      ;
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                    }
                    else {
                      uVar19 = (ulong)local_bf8;
                      pmVar9 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&local_aa0,(key_type *)local_820);
                      if (pmVar9->_M_string_length <= uVar19) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"WARNING: position ",0x12);
                        poVar10 = (ostream *)
                                  std::ostream::operator<<((ostream *)&std::cout,local_bf8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10," larger than chromosome ",0x18);
                        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10,(char *)local_820._0_8_,local_820._8_8_);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'s length ",10)
                        ;
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_aa0,(key_type *)local_820);
                        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                        (char)poVar10);
                        std::ostream::put((char)poVar10);
                        std::ostream::flush();
                      }
                      iVar20 = local_bf8;
                      iVar8 = rlength;
                      if ((rlength <= local_bf8) &&
                         (pmVar9 = std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&local_aa0,(key_type *)local_820),
                         (ulong)(long)(iVar8 + iVar20) < pmVar9->_M_string_length)) {
                        pmVar9 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&local_aa0,(key_type *)local_820);
                        std::__cxx11::string::substr((ulong)&local_c58,(ulong)pmVar9);
                        pmVar9 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&local_aa0,(key_type *)local_820);
                        std::__cxx11::string::substr((ulong)(local_a30 + 0x50),(ulong)pmVar9);
                        local_9a0._0_8_ = local_a30._80_8_ + local_9d8;
                        local_c98 = local_c88;
                        local_c78 = (char *)local_a30._80_8_;
                        std::__cxx11::string::
                        _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                                  ((string *)&local_c98,local_9a0,&local_c78);
                        if ((char *)local_a30._80_8_ != local_9d0) {
                          operator_delete((void *)local_a30._80_8_);
                        }
                        local_9a0._0_8_ = local_9a0 + 0x10;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_9a0,local_c58,local_c58 + local_c50);
                        local_980._M_p = local_970;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_980,local_c98,local_c98 + local_c90);
                        local_960 = *local_bd8;
                        local_95f = *local_cd8;
                        local_958 = (uint64_t)local_ce0;
                        local_950 = true;
                        local_94c = local_bf8;
                        std::vector<call,_std::allocator<call>_>::emplace_back<call>
                                  (&local_cb8,(call *)local_9a0);
                        if (local_980._M_p != local_970) {
                          operator_delete(local_980._M_p);
                        }
                        if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                          operator_delete((void *)local_9a0._0_8_);
                        }
                        pmVar9 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&local_aa0,(key_type *)local_820);
                        std::__cxx11::string::substr((ulong)&local_680,(ulong)pmVar9);
                        RC((string *)(local_a30 + 0x30),&local_680);
                        local_c78 = (char *)(local_a30._48_8_ + local_a30._56_8_);
                        local_af8 = (char *)local_a30._48_8_;
                        local_9a0._0_8_ = local_9a0 + 0x10;
                        std::__cxx11::string::
                        _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                                  ((string *)local_9a0,&local_c78,&local_af8);
                        std::__cxx11::string::operator=((string *)&local_c98,(string *)local_9a0);
                        if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                          operator_delete((void *)local_9a0._0_8_);
                        }
                        if ((undefined1 *)local_a30._48_8_ != local_a30 + 0x40) {
                          operator_delete((void *)local_a30._48_8_);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_680._M_dataplus._M_p != &local_680.field_2) {
                          operator_delete(local_680._M_dataplus._M_p);
                        }
                        pmVar9 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&local_aa0,(key_type *)local_820);
                        std::__cxx11::string::substr((ulong)&local_6a0,(ulong)pmVar9);
                        RC((string *)local_9a0,&local_6a0);
                        std::__cxx11::string::operator=((string *)&local_c58,(string *)local_9a0);
                        if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                          operator_delete((void *)local_9a0._0_8_);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                          operator_delete(local_6a0._M_dataplus._M_p);
                        }
                        local_9a0._0_8_ = local_9a0 + 0x10;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_9a0,local_c58,local_c58 + local_c50);
                        local_980._M_p = local_970;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_980,local_c98,local_c98 + local_c90);
                        local_960 = *local_bd8;
                        if (local_960 < 0x47) {
                          if (local_960 == 0x41) {
                            local_960 = 0x54;
                          }
                          else if (local_960 == 0x43) {
                            local_960 = 0x47;
                          }
                        }
                        else if (local_960 == 0x47) {
                          local_960 = 0x43;
                        }
                        else if (local_960 == 0x54) {
                          local_960 = 0x41;
                        }
                        local_95f = *local_cd8;
                        if (local_95f < 0x47) {
                          if (local_95f == 0x41) {
                            local_95f = 0x54;
                          }
                          else if (local_95f == 0x43) {
                            local_95f = 0x47;
                          }
                        }
                        else if (local_95f == 0x47) {
                          local_95f = 0x43;
                        }
                        else if (local_95f == 0x54) {
                          local_95f = 0x41;
                        }
                        local_958 = (uint64_t)local_ce0;
                        local_950 = true;
                        local_94c = local_bf8;
                        std::vector<call,_std::allocator<call>_>::emplace_back<call>
                                  (&local_cb8,(call *)local_9a0);
                        if (local_980._M_p != local_970) {
                          operator_delete(local_980._M_p);
                        }
                        if ((undefined1 *)local_9a0._0_8_ != local_9a0 + 0x10) {
                          operator_delete((void *)local_9a0._0_8_);
                        }
                        if (local_c98 != local_c88) {
                          operator_delete(local_c98);
                        }
                        if (local_c58 != local_c48) {
                          operator_delete(local_c58);
                        }
                      }
                      local_b98 = local_b98 + 1;
                      local_ce0 = (double)((long)local_ce0 + 1);
                    }
                  }
                }
                if (local_cd8 != local_cc8) {
                  operator_delete(local_cd8);
                }
                if (local_bd8 != local_bc8) {
                  operator_delete(local_bd8);
                }
                if ((pointer)local_b88._0_8_ != (pointer)(local_b88 + 0x10)) {
                  operator_delete((void *)local_b88._0_8_);
                }
                if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
                  operator_delete((void *)local_820._0_8_);
                }
                std::__cxx11::istringstream::~istringstream((istringstream *)&local_648);
                std::ios_base::~ios_base(local_5d0);
              }
              lVar21 = *(long *)(local_440._M_dataplus._M_p + -0x18);
            } while ((abStack_420[lVar21] & 2) == 0);
            if (local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                super__Vector_impl_data._M_start) goto LAB_001058bc;
          }
          else {
            local_b98 = 0;
LAB_001058bc:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. "
                       ,0x61);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
            std::ostream::put('P');
            std::ostream::flush();
          }
          iVar8 = k_nonis;
          uVar19 = ((long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
          iVar20 = 0;
          if (1 < uVar19) {
            uVar19 = uVar19 - 2;
            uVar18 = 2;
            iVar20 = 0;
            if (2 < uVar19) {
              piVar12 = &local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                         super__Vector_impl_data._M_start[4].pos;
              iVar20 = 0;
              do {
                if ((uVar18 & 1) == 0) {
                  if (piVar12[-0x2c] - piVar12[-0x58] < iVar8) {
                    bVar22 = false;
                  }
                  else {
                    bVar22 = iVar8 <= *piVar12 - piVar12[-0x2c];
                  }
                  *(bool *)(piVar12 + -0x2d) = bVar22;
                  *(bool *)(piVar12 + -0x17) = bVar22;
                  iVar20 = iVar20 + (uint)(bVar22 ^ 1);
                }
                uVar18 = uVar18 + 1;
                piVar12 = piVar12 + 0x16;
              } while (uVar19 != uVar18);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Sorting VCF by context ... ",0x1b);
          std::ostream::flush();
          __last = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __first = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar19 = ((long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
            lVar21 = 0x3f;
            if (uVar19 != 0) {
              for (; uVar19 >> lVar21 == 0; lVar21 = lVar21 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(call_const&,call_const&)>>
                      ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                       local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                       local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                       super__Vector_impl_data._M_finish,(ulong)(((uint)lVar21 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<bool_(*)(const_call_&,_const_call_&)>)0x1049a7);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(call_const&,call_const&)>>
                      ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)__first
                       ,(__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)__last
                       ,(_Iter_comp_iter<bool_(*)(const_call_&,_const_call_&)>)0x1049a7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Checking calls ... ",0x13);
          std::ostream::flush();
          local_648 = 0;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_ab8,
                     ((long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,&local_648,
                     (allocator_type *)local_9a0);
          std::ifstream::ifstream(&local_648);
          std::ifstream::open((string *)&local_648,0x10d1f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_660,2,(allocator_type *)local_9a0);
          local_bd8 = local_bc8;
          local_bd0 = 0;
          local_bc8[0] = 0;
          cVar6 = std::ios::widen((char)(string *)&local_648 +
                                  (char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18));
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_648,(string *)&local_c20,cVar6);
          local_b8c = iVar20;
          if ((abStack_628[*(long *)(CONCAT44(uStack_644,local_648) + -0x18)] & 2) == 0) {
            lVar26 = 0;
            lVar21 = 0;
            do {
              local_cd8 = local_cc8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_cd8,local_c20,local_c20 + local_c18);
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_9a0,(string *)&local_c20,_S_in);
              local_c58 = local_c48;
              local_c50 = 0;
              local_c48[0] = 0;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_9a0,(string *)&local_c58,'|');
              std::__cxx11::string::substr((ulong)local_820,(ulong)&local_c58);
              iVar8 = std::__cxx11::string::compare(local_820);
              if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
                operator_delete((void *)local_820._0_8_);
              }
              if (iVar8 == 0) {
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_9a0,(string *)&local_c58,'|');
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)local_820,(string *)&local_c58,_S_in);
                std::__cxx11::istringstream::operator=
                          ((istringstream *)local_9a0,(istringstream *)local_820);
                std::__cxx11::istringstream::~istringstream((istringstream *)local_820);
                std::ios_base::~ios_base(local_7a8);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_9a0,(string *)&local_c58,':');
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_9a0,(string *)&local_c58,':');
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)local_820,(string *)&local_c58,_S_in);
                std::__cxx11::istringstream::operator=
                          ((istringstream *)local_9a0,(istringstream *)local_820);
                std::__cxx11::istringstream::~istringstream((istringstream *)local_820);
                std::ios_base::~ios_base(local_7a8);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_9a0,(string *)&local_c58,'_');
                local_c98 = local_c88;
                local_c90 = 0;
                local_c88[0] = '\0';
                local_c78 = local_c68;
                local_c70 = 0;
                local_c68[0] = '\0';
                cVar6 = (char)(istream *)&local_648;
                cVar7 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) + cVar6);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c98,cVar7);
                cVar6 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) + cVar6);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c78,cVar6);
                local_af8 = local_ae8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_af8,local_c78,local_c78 + local_c70);
                cVar6 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) +
                                        (char)(istream *)&local_648);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c78,cVar6);
                if (local_c90 != local_c70) goto LAB_00106e88;
                if (local_c90 != 0) {
                  uVar18 = 0;
                  uVar19 = local_c90;
                  do {
                    uVar25 = ~uVar18;
                    if (local_c98[uVar25 + uVar19] != local_c78[uVar25 + local_c70]) {
                      std::__cxx11::string::substr((ulong)&local_bf8,(ulong)&local_c98);
                      std::__cxx11::string::substr((ulong)&local_a70,(ulong)&local_c78);
                      std::__cxx11::string::substr((ulong)(local_a30 + 0x10),(ulong)&local_c98);
                      local_820._0_8_ = local_a30._16_8_ + local_a30._24_8_;
                      local_b88._0_8_ = local_a30._16_8_;
                      local_bb8 = local_ba8;
                      std::__cxx11::string::
                      _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                                ((string *)&local_bb8,local_820,local_b88);
                      if ((undefined1 *)local_a30._16_8_ != local_a30 + 0x20) {
                        operator_delete((void *)local_a30._16_8_);
                      }
                      std::__cxx11::string::substr((ulong)&local_a40,(ulong)&local_c78);
                      local_820._0_8_ =
                           (long)&(local_a40->right_context)._M_dataplus._M_p + local_a38;
                      local_b18 = local_b08;
                      local_b88._0_8_ = local_a40;
                      std::__cxx11::string::
                      _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                                ((string *)&local_b18,local_820,local_b88);
                      if (local_a40 != (pointer)local_a30) {
                        operator_delete(local_a40);
                      }
                      local_ce0 = (double)CONCAT71(local_ce0._1_7_,local_c98[uVar25 + local_c90]);
                      cVar6 = local_c78[uVar25 + local_c70];
                      local_820._0_8_ = local_820 + 0x10;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_820,CONCAT44(uStack_bf4,local_bf8),
                                 local_bf0 + CONCAT44(uStack_bf4,local_bf8));
                      local_800 = &local_7f0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_800,local_bb8,local_bb8 + local_bb0);
                      local_7f0._M_left._0_1_ = local_ce0._0_1_;
                      local_7f0._M_right = (_Base_ptr)0x0;
                      local_7d0 = 0;
                      local_7cc = 0;
                      local_b88._0_8_ = local_b88 + 0x10;
                      local_7f0._M_left._1_1_ = cVar6;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_b88,local_a70,local_a70 + local_a68);
                      local_b68[0] = local_b58;
                      local_b28 = (double)lVar26;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_b68,local_b18,local_b18 + local_b10);
                      local_b48 = local_ce0._0_1_;
                      local_b40 = 0;
                      local_b38 = 0;
                      local_b34 = 0;
                      uVar19 = (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                      pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      local_b47 = cVar6;
                      local_a48 = lVar21;
                      if (0 < (long)uVar19) {
                        uVar19 = (uVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
                        do {
                          uVar25 = uVar19 >> 1;
                          iVar8 = std::__cxx11::string::compare((string *)(pcVar13 + uVar25));
                          if (iVar8 < 0) {
                            pcVar13 = pcVar13 + uVar25 + 1;
                            uVar25 = ~uVar25 + uVar19;
                          }
                          uVar19 = uVar25;
                        } while (0 < (long)uVar25);
                        uVar19 = (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                      }
                      uVar16 = ((long)pcVar13 -
                                (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x2e8ba2e8ba2e8ba3;
                      uVar25 = ((long)uVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
                      local_c38 = (double)CONCAT71(local_c38._1_7_,cVar6);
                      if (uVar16 < uVar25) {
                        local_a50 = local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                        bVar22 = false;
                        while (local_bf0 <=
                               local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar16].right_context.
                               _M_string_length) {
                          pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar16;
                          if (local_bf0 != 0) {
                            bVar27 = true;
                            uVar23 = 0;
                            do {
                              while (!bVar27) {
                                uVar23 = uVar23 + 1;
                                bVar27 = false;
                                if (uVar23 == local_bf0) goto LAB_001063e7;
                              }
                              cVar7 = *(char *)(CONCAT44(uStack_bf4,local_bf8) + uVar23);
                              cVar2 = (pcVar13->right_context)._M_dataplus._M_p[uVar23];
                              bVar27 = cVar7 == cVar2;
                              uVar23 = uVar23 + 1;
                            } while (uVar23 != local_bf0);
                            if (cVar7 != cVar2) break;
                          }
                          if ((((pcVar13->ALT == cVar6) && (pcVar13->REF == local_ce0._0_1_)) ||
                              ((pcVar13->ALT == local_ce0._0_1_ && (pcVar13->REF == cVar6)))) &&
                             (local_bb0 <= (pcVar13->left_context)._M_string_length)) {
                            if (local_bb0 == 0) {
LAB_001063b3:
                              local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar16] = 1;
                              bVar22 = true;
                            }
                            else {
                              bVar27 = true;
                              uVar23 = 0;
                              do {
                                while (bVar27) {
                                  pcVar1 = local_bb8 + uVar23;
                                  cVar7 = (pcVar13->left_context)._M_dataplus._M_p[uVar23];
                                  bVar27 = *pcVar1 == cVar7;
                                  uVar23 = uVar23 + 1;
                                  if (uVar23 == local_bb0) {
                                    if (*pcVar1 == cVar7) goto LAB_001063b3;
                                    goto LAB_001063c5;
                                  }
                                }
                                uVar23 = uVar23 + 1;
                                bVar27 = false;
                              } while (uVar23 != local_bb0);
                            }
                          }
LAB_001063c5:
                          uVar16 = uVar16 + 1;
                          if (uVar16 == uVar25) break;
                        }
LAB_001063e7:
                        if (!bVar22) goto LAB_001063f1;
                      }
                      else {
                        bVar22 = false;
LAB_001063f1:
                        pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        if (0 < (long)uVar19) {
                          uVar19 = (uVar19 >> 3) * 0x2e8ba2e8ba2e8ba3;
                          do {
                            uVar25 = uVar19 >> 1;
                            iVar8 = std::__cxx11::string::compare((string *)(pcVar13 + uVar25));
                            if (iVar8 < 0) {
                              pcVar13 = pcVar13 + uVar25 + 1;
                              uVar25 = ~uVar25 + uVar19;
                            }
                            uVar19 = uVar25;
                          } while (0 < (long)uVar25);
                          uVar25 = ((long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x2e8ba2e8ba2e8ba3;
                          cVar6 = local_c38._0_1_;
                        }
                        uVar19 = ((long)pcVar13 -
                                  (long)local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x2e8ba2e8ba2e8ba3;
                        if (uVar19 < uVar25) {
                          while (local_a68 <=
                                 local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar19].right_context.
                                 _M_string_length) {
                            pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>.
                                      _M_impl.super__Vector_impl_data._M_start + uVar19;
                            if (local_a68 != 0) {
                              bVar27 = true;
                              uVar16 = 0;
                              do {
                                while (!bVar27) {
                                  uVar16 = uVar16 + 1;
                                  bVar27 = false;
                                  if (uVar16 == local_a68) goto LAB_001065ba;
                                }
                                pcVar1 = local_a70 + uVar16;
                                cVar7 = (pcVar13->right_context)._M_dataplus._M_p[uVar16];
                                bVar27 = *pcVar1 == cVar7;
                                uVar16 = uVar16 + 1;
                              } while (uVar16 != local_a68);
                              cVar6 = local_c38._0_1_;
                              if (*pcVar1 != cVar7) break;
                            }
                            if ((((pcVar13->ALT == cVar6) && (pcVar13->REF == local_ce0._0_1_)) ||
                                ((pcVar13->ALT == local_ce0._0_1_ && (pcVar13->REF == cVar6)))) &&
                               (local_b10 <= (pcVar13->left_context)._M_string_length)) {
                              if (local_b10 == 0) {
LAB_0010659a:
                                local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar19] = 1;
                                bVar22 = true;
                              }
                              else {
                                bVar27 = true;
                                uVar16 = 0;
                                do {
                                  while (bVar27) {
                                    pcVar1 = local_b18 + uVar16;
                                    cVar7 = (pcVar13->left_context)._M_dataplus._M_p[uVar16];
                                    bVar27 = *pcVar1 == cVar7;
                                    uVar16 = uVar16 + 1;
                                    if (uVar16 == local_b10) {
                                      cVar6 = local_c38._0_1_;
                                      if (*pcVar1 == cVar7) goto LAB_0010659a;
                                      goto LAB_001065a4;
                                    }
                                  }
                                  uVar16 = uVar16 + 1;
                                  bVar27 = false;
                                  cVar6 = local_c38._0_1_;
                                } while (uVar16 != local_b10);
                              }
                            }
LAB_001065a4:
                            uVar19 = uVar19 + 1;
                            if (uVar19 == uVar25) break;
                          }
                        }
                      }
LAB_001065ba:
                      if (local_b68[0] != local_b58) {
                        operator_delete(local_b68[0]);
                      }
                      dVar31 = local_b28;
                      if ((pointer)local_b88._0_8_ != (pointer)(local_b88 + 0x10)) {
                        operator_delete((void *)local_b88._0_8_);
                      }
                      if (local_800 != &local_7f0) {
                        operator_delete(local_800);
                      }
                      if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
                        operator_delete((void *)local_820._0_8_);
                      }
                      if (local_b18 != local_b08) {
                        operator_delete(local_b18);
                      }
                      if (local_bb8 != local_ba8) {
                        operator_delete(local_bb8);
                      }
                      if (local_a70 != local_a60) {
                        operator_delete(local_a70);
                      }
                      if ((undefined1 *)CONCAT44(uStack_bf4,local_bf8) != local_be8) {
                        operator_delete((undefined1 *)CONCAT44(uStack_bf4,local_bf8));
                      }
                      lVar26 = (long)dVar31 + 1;
                      lVar21 = local_a48 + (ulong)(~bVar22 & 1);
                      uVar19 = local_c90;
                    }
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < uVar19);
                }
                if (local_af8 != local_ae8) {
                  operator_delete(local_af8);
                }
                if (local_c78 != local_c68) {
                  operator_delete(local_c78);
                }
                if (local_c98 != local_c88) {
                  operator_delete(local_c98);
                }
              }
              else {
                cVar6 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) +
                                        (char)&local_648);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c20,cVar6);
                cVar6 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) +
                                        (char)&local_648);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c20,cVar6);
                cVar6 = std::ios::widen((char)*(undefined8 *)
                                               (CONCAT44(uStack_644,local_648) + -0x18) +
                                        (char)&local_648);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_648,(string *)&local_c20,cVar6);
              }
              cVar6 = std::ios::widen((char)*(undefined8 *)(CONCAT44(uStack_644,local_648) + -0x18)
                                      + (char)&local_648);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_648,(string *)&local_c20,cVar6);
              if (local_c58 != local_c48) {
                operator_delete(local_c58);
              }
              std::__cxx11::istringstream::~istringstream((istringstream *)local_9a0);
              std::ios_base::~ios_base(local_928);
              if (local_cd8 != local_cc8) {
                operator_delete(local_cd8);
              }
            } while ((abStack_628[*(long *)(CONCAT44(uStack_644,local_648) + -0x18)] & 2) == 0);
          }
          else {
            lVar21 = 0;
            lVar26 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::ifstream::close();
          local_b88._0_8_ = (pointer)0x0;
          local_b88._8_8_ = (pointer)0x0;
          local_b88._16_8_ = (pointer)0x0;
          local_9a0._24_8_ = local_9a0 + 8;
          local_9a0._8_4_ = _S_red;
          local_9a0._16_8_ = 0;
          local_978 = 0;
          pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar17 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_b28 = (double)lVar26;
          local_980._M_p = (pointer)local_9a0._24_8_;
          if (local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar26 = 0x12;
            uVar19 = 0;
            do {
              if (local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] != 0) {
                local_820._0_4_ =
                     *(undefined4 *)((long)&(pcVar13->right_context)._M_dataplus._M_p + lVar26 * 4);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>
                          ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)local_9a0,(int *)local_820);
                pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pcVar17 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              uVar19 = uVar19 + 1;
              lVar26 = lVar26 + 0x16;
            } while (uVar19 < (ulong)(((long)pcVar17 - (long)pcVar13 >> 3) * 0x2e8ba2e8ba2e8ba3));
          }
          local_820._24_8_ = local_820 + 8;
          local_820._8_8_ = local_820._8_8_ & 0xffffffff00000000;
          local_820._16_8_ = 0;
          local_7f8 = 0;
          local_800 = (_Rb_tree_node_base *)local_820._24_8_;
          if (pcVar17 != pcVar13) {
            lVar26 = 0x14;
            uVar19 = 0;
            do {
              if ((local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19] != 0) &&
                 (*(char *)((long)&(pcVar13->right_context)._M_dataplus._M_p + lVar26 * 4) == '\0'))
              {
                local_cd8 = (byte *)CONCAT44(local_cd8._4_4_,
                                             *(undefined4 *)((long)pcVar13 + lVar26 * 4 + -8));
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>
                          ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)local_820,(int *)&local_cd8);
                pcVar13 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pcVar17 = local_cb8.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              uVar19 = uVar19 + 1;
              lVar26 = lVar26 + 0x16;
            } while (uVar19 < (ulong)(((long)pcVar17 - (long)pcVar13 >> 3) * 0x2e8ba2e8ba2e8ba3));
          }
          sVar5 = local_978;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          lVar26 = local_c00;
          std::ostream::put('P');
          poVar10 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"Non-isolated SNPs detected: ",0x1c);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
          plVar14 = (long *)std::ostream::operator<<(poVar10,local_b8c);
          std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
          std::ostream::put((char)plVar14);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TP = ",5);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TN = ",5);
          lVar15 = local_b98 - sVar5;
          lVar26 = lVar26 - ((long)local_b28 + lVar15);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FP = ",5);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FN = ",5);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"sensitivity = TP/(TP+FN) = ",0x1b);
          auVar28._8_4_ = (int)(sVar5 >> 0x20);
          auVar28._0_8_ = sVar5;
          auVar28._12_4_ = 0x45300000;
          dStack_c30 = auVar28._8_8_ - 1.9342813113834067e+25;
          local_c38 = dStack_c30 + ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
          local_ce0 = local_c38 * 100.0;
          auVar29._8_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar29._0_8_ = lVar15;
          auVar29._12_4_ = 0x45300000;
          poVar10 = std::ostream::_M_insert<double>
                              (local_ce0 /
                               ((auVar29._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0) +
                               local_c38));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"%",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"specificity = TN/(TN+FP) = ",0x1b);
          auVar30._8_4_ = (int)((ulong)lVar26 >> 0x20);
          auVar30._0_8_ = lVar26;
          auVar30._12_4_ = 0x45300000;
          dVar31 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0);
          auVar32._8_4_ = (int)((ulong)lVar21 >> 0x20);
          auVar32._0_8_ = lVar21;
          auVar32._12_4_ = 0x45300000;
          dStack_b20 = auVar32._8_8_ - 1.9342813113834067e+25;
          local_b28 = dStack_b20 + ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0);
          poVar10 = std::ostream::_M_insert<double>((dVar31 * 100.0) / (dVar31 + local_b28));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"%",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"precision   = TP/(TP+FP) = ",0x1b);
          poVar10 = std::ostream::_M_insert<double>(local_ce0 / (local_c38 + local_b28));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"%",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_820);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_9a0);
          std::vector<call,_std::allocator<call>_>::~vector
                    ((vector<call,_std::allocator<call>_> *)local_b88);
          if (local_bd8 != local_bc8) {
            operator_delete(local_bd8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_660);
          std::ifstream::~ifstream(&local_648);
          if (local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_ab8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<call,_std::allocator<call>_>::~vector(&local_cb8);
          std::ifstream::~ifstream(&local_440);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_ad8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
            operator_delete(local_9c0._M_dataplus._M_p);
          }
          if (local_c20 != local_c10) {
            operator_delete(local_c20);
          }
          std::ifstream::~ifstream(local_238);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_aa0);
          return 0;
        }
      }
      goto switchD_00104a0a_caseD_64;
    }
    std::__cxx11::string::string((string *)local_238,_optarg,(allocator *)&local_440);
    this = &vcf_path_abi_cxx11_;
  }
  std::__cxx11::string::operator=((string *)this,(string *)local_238);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0]);
  }
  goto LAB_001049ee;
switchD_00104a0a_caseD_6c:
  rlength = atoi(_optarg);
  goto LAB_001049ee;
}

Assistant:

int main(int argc, char** argv){

	if(argc < 4) help();

	int opt;
	while ((opt = getopt(argc, argv, "hv:c:f:l:k:")) != -1){
		switch (opt){
			case 'h':
				help();
			break;
			case 'v':
				vcf_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'c':
				calls_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'f':
				ref_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'l':
				rlength = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'k':
				k_nonis = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			default:
				help();
			return -1;
		}
	}

	rlength = rlength == 0 ? rlength_def : rlength;
	k_nonis = k_nonis == 0 ? k_nonis_def : k_nonis;

	if(vcf_path.compare("")==0 or calls_path.compare("")==0 or ref_path.compare("")==0) help();

	//reference indexed by contig: e.g. string chr1 = ref["chr1"]
	std::map<string,string> ref;

	cout << "Loading reference ... " << flush;

	/*
	 *
	 * READ REFERENCE, LOAD CONTIGS IN MEMORY
	 *
	 */
	ifstream ref_file;
	ref_file.open(ref_path, ios::in);

	string line;
	string contig;

	vector<string> contigs;

	int nonisolated_snps=0;

	while(not ref_file.eof()){

		getline(ref_file, line);

		if(line[0] == '>'){//new contig name

			contig = line.substr(1);
			contigs.push_back(contig);

			ref[contig] = string();

		}else{

			for (auto & c: line) c = toupper(c);
			ref[contig].append(line);

		}

	}

	cout << "done." << endl;

	uint64_t N = 0;

	cout << "Contig\tlength" << endl;
	for(auto c : contigs){

		cout << c << "\t" << ref[c].length() << endl;

		N+=ref[c].length();

	}
	//cout << endl;

	ref_file.close();


	/*
	 * LOAD SNPS FROM VCF
	 */

	cout << "Loading VCF ... " << flush;

	uint64_t n_snps=0;//number of SNPs in the VCF

	//read vcf
	ifstream vcf_file;
	vcf_file.open(vcf_path, ios::in);

	vector<call> calls_vcf;
	uint64_t ID = 0;

	while(not vcf_file.eof()){

		getline(vcf_file, line);

		if(line.size()>0 and line[0] != '#'){

			std::istringstream is( line );

			string chr;
			int pos;
			string id;
			string REF;
			string ALT;

			is >> chr >> pos >> id >> REF >> ALT;

			pos--;//coordinates are 1-based in the vcf file

			//keep just SNPs
			if(		(REF.compare("A")==0 or REF.compare("C")==0 or REF.compare("T")==0 or REF.compare("G")==0) and
					(ALT.compare("A")==0 or ALT.compare("C")==0 or ALT.compare("T")==0 or ALT.compare("G")==0)
			){

				if(ref[chr].compare("")!=0){//if chromosome exists in the reference file

					n_snps++;

					//insert forward call

					if(pos >= ref[chr].size()){

						cout << "WARNING: position " << pos << " larger than chromosome " << chr << "'s length " << ref[chr].size() << endl;

					}

					if(pos >= rlength && pos+rlength < ref[chr].size()){

						assert(pos+1<ref[chr].size());
						assert(pos+1+rlength<=ref[chr].size());
						assert(pos>=rlength);
						assert(pos-rlength<ref[chr].size());
						assert(pos<=ref[chr].size());

						string right_context = ref[chr].substr(pos+1,rlength);
						string left_context = REV(ref[chr].substr(pos-rlength,rlength));

						assert(REF.size()>0);
						assert(ALT.size()>0);

						calls_vcf.push_back(call {right_context, left_context, REF[0], ALT[0], ID, true, pos});

						//insert RC call

						left_context = REV(RC(ref[chr].substr(pos+1,rlength)));
						right_context = RC(ref[chr].substr(pos-rlength,rlength));

						calls_vcf.push_back(call {right_context, left_context, RC(REF[0]), RC(ALT[0]), ID, true, pos});

					}

					++ID;

				}else{

					cout << "WARNING: chromosome " << chr << " not found. " << endl;

				}

			}

		}

	}


	if(calls_vcf.size()==0){

		cout << "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. " << endl;

	}

	for(int i=2;calls_vcf.size() > 1 && i<calls_vcf.size()-2;++i){

		if(i%2==0){

			calls_vcf[i].isolated = calls_vcf[i].pos - calls_vcf[i-2].pos >= k_nonis and calls_vcf[i+2].pos - calls_vcf[i].pos >= k_nonis;
			calls_vcf[i+1].isolated = calls_vcf[i].isolated;

			if(not calls_vcf[i].isolated){

				//cout << calls_vcf[i].pos - calls_vcf[i-2].pos << " " << calls_vcf[i+2].pos - calls_vcf[i].pos << endl;
				nonisolated_snps++;

			}

		}

	}

	cout << "done." << endl;

	cout << "Sorting VCF by context ... " << flush;
	std::sort(calls_vcf.begin(), calls_vcf.end(), comp);
	cout << "done." << endl;

	vcf_file.close();

	//vector<call> calls;

	/*
	 *
	 * LOAD CALLS FROM FASTA GENERATED BY SNP-CALLING TOOL, SEARCH THEM IN THE RANGE STRUCTURE OF
	 * CONTAINING VCF CALLS
	 *
	 */

	uint64_t n_calls = 0;//number of SNPs in input fasta file (including hidden SNPs inside the sequences)

	cout << "Checking calls ... " << flush;

	uint64_t FP = 0;
	uint64_t FN = 0;
	uint64_t TP = 0;
	uint64_t TN = 0;

	auto assigned = vector<int>(calls_vcf.size(),0);

	//read calls
	ifstream calls_file;
	calls_file.open(calls_path, ios::in);

	//left/right contexts per sample
	vector<string> left_contexts = vector<string>(2);
	string right_context;

	getline(calls_file, line);

	int last_id = 0;
	int non_isolated_SNPs = 0;

	while(not calls_file.eof()){

		//header of first read

		string h1=line;

		std::istringstream is( line );
		string pos;
		getline(is,pos,'|');

		if(pos.substr(0,4).compare(">SNP")==0){//filter out indels

			getline(is,pos,'|');

			is = istringstream(pos);
			getline(is,pos,':');
			getline(is,pos,':');

			is = istringstream(pos);
			getline(is,pos,'_');

			int ipos = atoi(pos.c_str());//position of leftmost SNP
			ipos = 0;

			string DNA1, DNA2;
			getline(calls_file, DNA1);//DNA of first read

			getline(calls_file, DNA2);//skip header of second read
			string h2=DNA2;

			getline(calls_file, DNA2);//DNA of second read

			//some consistency checks on the file

			/*if(DNA1.substr(DNA1.size() - ipos).compare(DNA2.substr(DNA2.size() - ipos)) != 0){

				cout << "Error: malformed SNP file. Last " << ipos << " bases do not coincide\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			if(DNA1.length()!=DNA2.length()){

				cout << "Error: malformed SNP file. Two reads with different length in a SNP:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}

			/*if(DNA1[DNA1.size()-ipos-1] == DNA2[DNA2.size()-ipos-1]){

				cout << "Error: malformed SNP file. No SNP at specified position:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			//search all SNPs from the leftmost backwards
			while(ipos<DNA1.size()){

				//if SNP found
				if(DNA1[DNA1.size()-ipos-1] != DNA2[DNA2.size()-ipos-1]){

					n_calls++;

					string right_context1 = DNA1.substr(DNA1.size()-ipos);
					string right_context2 = DNA2.substr(DNA2.size()-ipos);

					string left_context1 = REV(DNA1.substr(0, DNA1.size()-ipos-1));
					string left_context2 = REV(DNA2.substr(0, DNA2.size()-ipos-1));

					char REF = DNA1[DNA1.size()-ipos-1];
					char ALT = DNA2[DNA2.size()-ipos-1];

					call c1 = {right_context1, left_context1, REF, ALT, 0, false};
					call c2 = {right_context2, left_context2, REF, ALT, 0, false};

					non_isolated_SNPs++;

					//Search c1 in the range structure

					auto it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c1, comp);

					uint64_t idx = std::distance(calls_vcf.begin(), it);

					bool found = false;

					/*
					 * while right context of c1 prefixes right context in range of VCF calls
					 */

					while(idx < calls_vcf.size() and is_prefix(right_context1, calls_vcf[idx].right_context)){

						if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
							(is_prefix(left_context1, calls_vcf[idx].left_context))	){

							found = true;
							assigned[idx] = 1;

						}

						++idx;

					}

					if(not found){

						//Search c2 in the range structure

						it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c2, comp);

						idx = std::distance(calls_vcf.begin(), it);

						/*
						 * while right context of c2 prefixes right context in range of VCF calls
						 */
						while(idx < calls_vcf.size() and is_prefix(right_context2, calls_vcf[idx].right_context)){

							if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
								(is_prefix(left_context2, calls_vcf[idx].left_context))	){

								found = true;
								assigned[idx] = 1;

							}

							++idx;

						}

					}

					if(not found) FP++;

				}

				++ipos;

			}

			non_isolated_SNPs--;

		}else{

			//skip event

			getline(calls_file, line);//DNA of first read
			getline(calls_file, line);//header of second read
			getline(calls_file, line);//DNA of second read

		}

		getline(calls_file, line);//header of first read

	}

	cout << "done." << endl;

	calls_file.close();



	vector<call> found_calls_vcf;//count how many SNPs in the VCF have been found

	std::set<int> found;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i]){

			found.insert(calls_vcf[i].ID);

		}

	}

	//nonisolated SNPs found
	std::set<int> found_nonisolated;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i] and not calls_vcf[i].isolated){

			found_nonisolated.insert(calls_vcf[i].ID);

		}

	}

	TP = found.size();

	//number of true SNPs that are not found
	FN = n_snps - TP;

	//this is a lower bound because we may call multiple times the same SNP
	TN = (N - n_calls) -  FN;

	cout << endl << "Non-isolated SNPs detected: " << found_nonisolated.size()  << "/" << nonisolated_snps << endl;

	cout << endl;
	cout << "TP = " << TP << endl;
	cout << "TN = " << TN << endl;
	cout << "FP = " << FP << endl;
	cout << "FN = " << FN << endl;

	cout << "sensitivity = TP/(TP+FN) = " << 100*double(TP)/(double(TP)+double(FN)) << "%" << endl;
	cout << "specificity = TN/(TN+FP) = " << 100*double(TN)/(double(TN)+double(FP)) << "%" << endl;
	cout << "precision   = TP/(TP+FP) = " << 100*double(TP)/(double(TP)+double(FP)) << "%" << endl;



}